

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O3

string * flatbuffers::anon_unknown_0::GenerateFBS
                   (string *__return_storage_ptr__,Parser *parser,string *file_name,bool no_log)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  ushort uVar3;
  ProtoIdGapAction PVar4;
  Namespace *this;
  EnumDef *this_00;
  EnumVal *ev;
  FieldDef *pFVar5;
  IDLOptions *pIVar6;
  size_type sVar7;
  undefined8 *puVar8;
  _Rb_tree_node_base *p_Var9;
  StructDef *pSVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  pointer ppFVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var17;
  string *extraout_RAX;
  undefined1 uVar18;
  undefined7 in_register_00000009;
  ushort *puVar19;
  StructDef *pSVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *attribute;
  ulong uVar21;
  pointer ppFVar22;
  Parser *pPVar23;
  _Alloc_hider _Var24;
  short sVar25;
  long lVar26;
  undefined8 uVar27;
  int iVar28;
  pointer ppNVar29;
  pointer ppEVar30;
  string *psVar31;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __i;
  _Alloc_hider _Var32;
  long lVar33;
  vector<unsigned_short,_std::allocator<unsigned_short>_> used_proto_ids;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  proto_ids;
  string basename;
  voffset_t proto_id;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  Namespace *last_namespace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  StructDef *local_108;
  undefined1 local_100 [32];
  _Prime_rehash_policy local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  Parser *local_c0;
  undefined4 local_b4;
  string *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  undefined1 local_68 [32];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *local_48;
  Namespace *local_40;
  pointer local_38;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000009,no_log);
  ppNVar29 = (parser->namespaces_).
             super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (StructDef *)file_name;
  local_c0 = parser;
  local_b0 = __return_storage_ptr__;
  if (ppNVar29 !=
      (parser->namespaces_).
      super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pIVar6 = &parser->opts;
    do {
      this = *ppNVar29;
      if (this->from_table == 0) {
        uVar15 = 0;
      }
      else {
        lVar26 = -0x20;
        uVar21 = 0;
        do {
          std::__cxx11::string::append
                    ((char *)((long)&(((this->components).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + lVar26));
          uVar21 = uVar21 + 1;
          uVar15 = this->from_table;
          lVar26 = lVar26 + -0x20;
        } while (uVar21 < uVar15);
      }
      parser = local_c0;
      if (((local_c0->opts).proto_mode == true) &&
         ((local_c0->opts).proto_namespace_suffix._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&this->components,
                 (this->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -uVar15,
                 &pIVar6->proto_namespace_suffix);
      }
      ppNVar29 = ppNVar29 + 1;
    } while (ppNVar29 !=
             (parser->namespaces_).
             super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (string *)0x0;
  local_68[0x10] = '\0';
  std::operator+(&local_148,"// Generated from ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
  puVar19 = (ushort *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_100._16_8_ = *(undefined8 *)puVar19;
    local_100._24_8_ = puVar8[3];
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
  }
  else {
    local_100._16_8_ = *(undefined8 *)puVar19;
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar8;
  }
  local_100._8_8_ = puVar8[1];
  *puVar8 = puVar19;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::_M_append(local_68,local_100._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,(ulong)(local_148.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((parser->opts).include_dependence_headers == true) {
    p_Var9 = (parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(parser->included_files_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      iVar28 = 0;
      do {
        if (p_Var9[1]._M_left != (_Base_ptr)0x0) {
          local_100._0_8_ = local_100 + 0x10;
          local_100._8_8_ = 0;
          local_100._16_8_ = local_100._16_8_ & 0xffffffffffffff00;
          if ((local_c0->opts).keep_prefix == true) {
            StripExtension(&local_148,(string *)&p_Var9[1]._M_parent);
            std::__cxx11::string::operator=((string *)local_100,(string *)&local_148);
            uVar27 = local_148.field_2._M_allocated_capacity;
            _Var24._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
LAB_002c85f6:
              operator_delete(_Var24._M_p,(ulong)(uVar27 + 1));
            }
          }
          else {
            StripExtension(&local_128,(string *)&p_Var9[1]._M_parent);
            StripPath(&local_148,&local_128);
            std::__cxx11::string::operator=((string *)local_100,(string *)&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            uVar27 = local_128.field_2._M_allocated_capacity;
            _Var24._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) goto LAB_002c85f6;
          }
          std::operator+(&local_128,"include \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          puVar19 = (ushort *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
            local_148.field_2._8_8_ = puVar8[3];
          }
          else {
            local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
            local_148._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_148._M_string_length = puVar8[1];
          *puVar8 = puVar19;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append(local_68,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
          }
          iVar28 = iVar28 + 1;
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        parser = local_c0;
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      if (iVar28 != 0) {
        std::__cxx11::string::append(local_68);
      }
    }
  }
  local_40 = (Namespace *)0x0;
  pSVar20 = (StructDef *)
            (parser->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (StructDef *)
            (parser->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar20 != pSVar10) {
    do {
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_100 + 0x10);
      this_00 = (EnumDef *)(pSVar20->super_Definition).name._M_dataplus._M_p;
      if (((local_c0->opts).include_dependence_headers != true) ||
         ((this_00->super_Definition).generated == false)) {
        local_108 = pSVar20;
        GenNameSpace((this_00->super_Definition).defined_namespace,(string *)local_68,&local_40);
        uVar18 = 0x9a;
        GenComment(&(this_00->super_Definition).doc_comment,(string *)local_68,(CommentConfig *)0x0,
                   "");
        if (this_00->is_union == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,"union ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
          std::__cxx11::string::_M_append((char *)local_68,local_100._0_8_);
          uVar27 = local_100._16_8_;
          _Var24._M_p = (pointer)local_100._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._0_8_ != paVar16) {
LAB_002c8878:
            operator_delete(_Var24._M_p,(ulong)(uVar27 + 1));
          }
        }
        else {
          std::operator+(&local_148,"enum ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
          puVar19 = (ushort *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_100._16_8_ = *(undefined8 *)puVar19;
            local_100._24_8_ = puVar8[3];
            local_100._0_8_ = paVar16;
          }
          else {
            local_100._16_8_ = *(undefined8 *)puVar19;
            local_100._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar8;
          }
          local_100._8_8_ = puVar8[1];
          *puVar8 = puVar19;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_68,local_100._0_8_);
          uVar18 = SUB81(puVar19,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._0_8_ != paVar16) {
            operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
          }
          uVar27 = local_148.field_2._M_allocated_capacity;
          _Var24._M_p = local_148._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_002c8878;
        }
        (anonymous_namespace)::GenType_abi_cxx11_
                  (&local_148,(_anonymous_namespace_ *)&this_00->underlying_type,(Type *)0x1,
                   (bool)uVar18);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar19 = (ushort *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_100._16_8_ = *(undefined8 *)puVar19;
          local_100._24_8_ = puVar8[3];
          local_100._0_8_ = paVar16;
        }
        else {
          local_100._16_8_ = *(undefined8 *)puVar19;
          local_100._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar8;
        }
        local_100._8_8_ = puVar8[1];
        *puVar8 = puVar19;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_68,local_100._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != paVar16) {
          operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        for (ppEVar30 = (this_00->vals).vec.
                        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppEVar30 !=
            *(pointer *)
             ((long)&(this_00->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
             + 8); ppEVar30 = ppEVar30 + 1) {
          ev = *ppEVar30;
          uVar18 = 0xba;
          GenComment(&ev->doc_comment,(string *)local_68,(CommentConfig *)0x0,"  ");
          if (this_00->is_union == true) {
            (anonymous_namespace)::GenType_abi_cxx11_
                      (&local_128,(_anonymous_namespace_ *)&ev->union_type,(Type *)0x0,(bool)uVar18)
            ;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x36edba);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148.field_2._8_8_ = puVar8[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_148._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_100._16_8_ = *(undefined8 *)puVar19;
              local_100._24_8_ = puVar8[3];
              local_100._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_100 + 0x10);
            }
            else {
              local_100._16_8_ = *(undefined8 *)puVar19;
              local_100._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar8;
            }
            local_100._8_8_ = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_68,local_100._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_100 + 0x10)) {
              operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            uVar27 = local_128.field_2._M_allocated_capacity;
            _Var24._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_002c8cc2:
              operator_delete(_Var24._M_p,(ulong)(uVar27 + 1));
            }
          }
          else {
            std::operator+(&local_a8,"  ",&ev->name);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_128.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_128.field_2._8_8_ = puVar8[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_128._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_128._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            EnumDef::ToString_abi_cxx11_(&local_88,this_00,ev);
            uVar27 = (byte *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              uVar27 = local_128.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar27 < (byte *)(local_128._M_string_length + local_88._M_string_length)) {
              uVar27 = (byte *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                uVar27 = local_88.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar27 < (byte *)(local_128._M_string_length + local_88._M_string_length))
              goto LAB_002c8ae9;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_88,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
            }
            else {
LAB_002c8ae9:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_128,(ulong)local_88._M_dataplus._M_p);
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148.field_2._8_8_ = puVar8[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_148._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(byte *)puVar19 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_100._16_8_ = *(undefined8 *)puVar19;
              local_100._24_8_ = puVar8[3];
              local_100._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_100 + 0x10);
            }
            else {
              local_100._16_8_ = *(undefined8 *)puVar19;
              local_100._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar8;
            }
            local_100._8_8_ = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_68,local_100._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_100 + 0x10)) {
              operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,
                              (ulong)(local_88.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              (ulong)(local_128.field_2._M_allocated_capacity + 1));
            }
            uVar27 = local_a8.field_2._M_allocated_capacity;
            _Var24._M_p = local_a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_002c8cc2;
          }
        }
        std::__cxx11::string::append((char *)local_68);
        pSVar10 = (StructDef *)
                  (local_c0->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pSVar20 = local_108;
      }
      pSVar20 = (StructDef *)&(pSVar20->super_Definition).name._M_string_length;
    } while (pSVar20 != pSVar10);
  }
  local_38 = (local_c0->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_38 ==
      (local_c0->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_002c9ac5:
    (local_b0->_M_dataplus)._M_p = (pointer)&local_b0->field_2;
    if ((string *)local_68._0_8_ == (string *)(local_68 + 0x10)) {
      (local_b0->field_2)._M_allocated_capacity = CONCAT71(local_68._17_7_,local_68[0x10]);
      *(undefined8 *)((long)&local_b0->field_2 + 8) = local_68._24_8_;
    }
    else {
      (local_b0->_M_dataplus)._M_p = (pointer)local_68._0_8_;
      (local_b0->field_2)._M_allocated_capacity = CONCAT71(local_68._17_7_,local_68[0x10]);
    }
    local_b0->_M_string_length = local_68._8_8_;
    return (string *)local_68._8_8_;
  }
  pPVar23 = local_c0;
LAB_002c8d2a:
  pSVar20 = *local_38;
  PVar4 = (pPVar23->opts).proto_id_gap_action;
  if ((anonymous_namespace)::
      HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
      ::ID_abi_cxx11_ == '\0') {
    _GLOBAL__N_1::GenerateFBS();
  }
  ppFVar22 = (pSVar20->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar13 = (pSVar20->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_108 = pSVar20;
  if (ppFVar22 != ppFVar13) {
    local_48 = &(pSVar20->fields).vec;
    do {
      pFVar5 = *ppFVar22;
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       *)&(pFVar5->super_Definition).attributes,
                      (key_type *)
                      (anonymous_namespace)::
                      HasFieldWithId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                      ::ID_abi_cxx11_);
      if ((((_Rb_tree_header *)cVar11._M_node !=
            &(pFVar5->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) &&
          (*(long *)(cVar11._M_node + 2) != 0)) &&
         (*(long *)(*(long *)(cVar11._M_node + 2) + 0x28) != 0)) {
        if ((anonymous_namespace)::
            HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
            ::ID_abi_cxx11_ == '\0') {
          _GLOBAL__N_1::GenerateFBS();
        }
        ppFVar22 = (local_108->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar13 = (local_108->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_002c9428;
      }
      ppFVar22 = ppFVar22 + 1;
    } while (ppFVar22 != ppFVar13);
  }
  local_100._0_8_ = &aStack_d0;
  local_100._8_8_ = 1;
  local_100._16_8_ = (byte *)0x0;
  local_100._24_8_ = 0;
  local_e0._M_max_load_factor = 1.0;
  local_e0._M_next_resize = 0;
  aStack_d0._M_allocated_capacity = 0;
  aStack_d0._M_local_buf[8] = 1;
  pPVar23 = local_c0;
  goto LAB_002c8df1;
LAB_002c9428:
  if (ppFVar22 == ppFVar13) goto LAB_002c9507;
  pFVar5 = *ppFVar22;
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   *)&(pFVar5->super_Definition).attributes,
                  (key_type *)
                  (anonymous_namespace)::
                  HasNonPositiveFieldId(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                  ::ID_abi_cxx11_);
  if ((((_Rb_tree_header *)cVar11._M_node !=
        &(pFVar5->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) &&
      (lVar26 = *(long *)(cVar11._M_node + 2), lVar26 != 0)) && (*(long *)(lVar26 + 0x28) != 0)) {
    paVar16 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(lVar26 + 0x20);
    if (paVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_002c9c03;
    bVar2 = paVar16->_M_local_buf[0];
    paVar14 = paVar16;
    while (bVar2 != 0) {
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar14->_M_local_buf + 1);
      if ((int)(char)bVar2 - 0x30U < 10) {
        if ((bVar2 == 0x30) && ((paVar14->_M_local_buf[0] & 0xdfU) == 0x58)) {
          iVar28 = 0x10;
          goto LAB_002c94d7;
        }
        break;
      }
      bVar2 = paVar14->_M_local_buf[0];
    }
    iVar28 = 10;
LAB_002c94d7:
    local_148._M_dataplus._M_p = (pointer)paVar16;
    uVar15 = strtoll_l(paVar16->_M_local_buf,(char **)&local_148,iVar28,ClassicLocale::instance_);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p == paVar16) || (*local_148._M_dataplus._M_p != 0)) ||
       (0xffff < uVar15)) {
      psVar31 = local_b0;
      goto joined_r0x002c9bde;
    }
  }
  ppFVar22 = ppFVar22 + 1;
  goto LAB_002c9428;
LAB_002c9507:
  ExtractProtobufIds((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148,local_48)
  ;
  psVar31 = local_b0;
  sVar7 = local_148._M_string_length;
  _Var24._M_p = local_148._M_dataplus._M_p;
  _Var32._M_p = local_148._M_dataplus._M_p;
  if (local_148._M_dataplus._M_p != (pointer)local_148._M_string_length) {
    uVar15 = (long)(local_148._M_string_length - (long)local_148._M_dataplus._M_p) >> 1;
    lVar26 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_148._M_dataplus._M_p,local_148._M_string_length,
               ((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (_Var24._M_p,sVar7);
    _Var24._M_p = local_148._M_dataplus._M_p;
    _Var32._M_p = (pointer)local_148._M_string_length;
  }
  do {
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)_Var24._M_p + 2);
    if (paVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var32._M_p) break;
    uVar3 = *(ushort *)_Var24._M_p;
    _Var24._M_p = (pointer)paVar16;
  } while (*(ushort *)paVar16 != uVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_148._M_dataplus._M_p,
                    local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
  }
  if (paVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var32._M_p) {
    if ((anonymous_namespace)::
        HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
        ::ID_abi_cxx11_ == '\0') {
      _GLOBAL__N_1::GenerateFBS();
    }
    ppFVar13 = (local_108->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar22 = (local_108->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar31 = local_b0,
        ppFVar22 != ppFVar13; ppFVar22 = ppFVar22 + 1) {
      pFVar5 = *ppFVar22;
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       *)&(pFVar5->super_Definition).attributes,
                      (key_type *)
                      (anonymous_namespace)::
                      HasFieldIdFromReservedIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&,std::vector<unsigned_short,std::allocator<unsigned_short>>const&)
                      ::ID_abi_cxx11_);
      if ((((_Rb_tree_header *)cVar11._M_node !=
            &(pFVar5->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) &&
          (lVar26 = *(long *)(cVar11._M_node + 2), lVar26 != 0)) && (*(long *)(lVar26 + 0x28) != 0))
      {
        local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffffffff0000;
        paVar16 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(lVar26 + 0x20);
        if (paVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_002c9c03;
        bVar2 = paVar16->_M_local_buf[0];
        paVar14 = paVar16;
        while (bVar2 != 0) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar14->_M_local_buf + 1);
          if ((int)(char)bVar2 - 0x30U < 10) {
            if ((bVar2 == 0x30) && ((paVar14->_M_local_buf[0] & 0xdfU) == 0x58)) {
              iVar28 = 0x10;
              goto LAB_002c9672;
            }
            break;
          }
          bVar2 = paVar14->_M_local_buf[0];
        }
        iVar28 = 10;
LAB_002c9672:
        local_148._M_dataplus._M_p = (pointer)paVar16;
        uVar15 = strtoll_l(paVar16->_M_local_buf,(char **)&local_148,iVar28,ClassicLocale::instance_
                          );
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_148._M_dataplus._M_p != paVar16) && (*local_148._M_dataplus._M_p == 0)) {
          uVar21 = uVar15;
          if (0xfffe < uVar15) {
            uVar21 = 0xffff;
          }
          local_128._M_dataplus._M_p._0_2_ = (short)uVar21;
          if ((uVar15 < 0x10000) &&
             (_Var17 = std::
                       __find_if<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                 ((local_108->reserved_ids).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (local_108->reserved_ids).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_128),
             _Var17._M_current ==
             (local_108->reserved_ids).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish)) goto LAB_002c96d3;
        }
        psVar31 = local_b0;
        goto joined_r0x002c9bde;
      }
LAB_002c96d3:
    }
    if (PVar4 != NO_OP) {
      ExtractProtobufIds((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148,
                         local_48);
      sVar7 = local_148._M_string_length;
      _Var24._M_p = local_148._M_dataplus._M_p;
      _Var32._M_p = local_148._M_dataplus._M_p;
      if (local_148._M_dataplus._M_p != (pointer)local_148._M_string_length) {
        uVar15 = (long)(local_148._M_string_length - (long)local_148._M_dataplus._M_p) >> 1;
        lVar26 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar26 == 0; lVar26 = lVar26 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_148._M_dataplus._M_p,local_148._M_string_length,
                   ((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (_Var24._M_p,sVar7);
        _Var24._M_p = local_148._M_dataplus._M_p;
        _Var32._M_p = (pointer)local_148._M_string_length;
      }
      do {
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)_Var24._M_p + 2);
        if (paVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var32._M_p) break;
        uVar3 = *(ushort *)_Var24._M_p;
        _Var24._M_p = (pointer)paVar16;
      } while (uVar3 + 1 == (uint)*(ushort *)paVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_148._M_dataplus._M_p,
                        local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
      }
      if (paVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var32._M_p) {
        if ((char)local_b4 == '\0') {
          _GLOBAL__N_1::GenerateFBS((_GLOBAL__N_1 *)local_108);
        }
        if (PVar4 == ERROR) goto LAB_002c9b35;
      }
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    ppFVar22 = (local_108->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar13 = (local_108->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar22 != ppFVar13) {
      do {
        pFVar5 = *ppFVar22;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_148._M_string_length = 2;
        local_148.field_2._M_allocated_capacity._0_3_ = 0x6469;
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         *)&(pFVar5->super_Definition).attributes,&local_148);
        if ((_Rb_tree_header *)cVar11._M_node ==
            &(pFVar5->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
          lVar26 = 0;
        }
        else {
          lVar26 = *(long *)(cVar11._M_node + 2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if (lVar26 == 0) {
          if ((char)local_b4 == '\0') {
            _GLOBAL__N_1::GenerateFBS((_GLOBAL__N_1 *)local_108);
          }
          local_100._0_8_ = &aStack_d0;
          local_100._8_8_ = 1;
          local_100._16_8_ = (byte *)0x0;
          local_100._24_8_ = 0;
          local_e0._M_max_load_factor = 1.0;
          local_e0._4_4_ = 0;
          local_e0._M_next_resize = 0;
          aStack_d0._M_allocated_capacity = 0;
          aStack_d0._M_local_buf[8] = 0;
          psVar31 = local_b0;
          goto LAB_002c9a5c;
        }
        if ((*(long *)(lVar26 + 0x28) == 0) && ((pFVar5->value).type.base_type == BASE_TYPE_UNION))
        {
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<int_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&local_128,
                     &(anonymous_namespace)::
                      MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)
                      ::UNION_ID,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar5);
        }
        else {
          local_a8._M_dataplus._M_p = local_a8._M_dataplus._M_p & 0xffffffffffff0000;
          paVar16 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(lVar26 + 0x20);
          if (paVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
LAB_002c9c03:
            __assert_fail("s && val",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                          ,0x14b,
                          "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]"
                         );
          }
          bVar2 = paVar16->_M_local_buf[0];
          paVar14 = paVar16;
          while (bVar2 != 0) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar14->_M_local_buf + 1);
            if ((int)(char)bVar2 - 0x30U < 10) {
              if ((bVar2 == 0x30) && ((paVar14->_M_local_buf[0] & 0xdfU) == 0x58)) {
                iVar28 = 0x10;
                goto LAB_002c98c1;
              }
              break;
            }
            bVar2 = paVar14->_M_local_buf[0];
          }
          iVar28 = 10;
LAB_002c98c1:
          local_148._M_dataplus._M_p = (pointer)paVar16;
          uVar21 = strtoll_l(paVar16->_M_local_buf,(char **)&local_148,iVar28,
                             ClassicLocale::instance_);
          uVar15 = 0;
          if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar16) && (*local_148._M_dataplus._M_p == 0)) &&
             (uVar15 = uVar21, 0xfffe < uVar21)) {
            uVar15 = 0xffff;
          }
          local_a8._M_dataplus._M_p._0_2_ = (short)uVar15;
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<unsigned_short&,std::__cxx11::string_const&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&local_128,(unsigned_short *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar5);
        }
        sVar7 = local_128._M_string_length;
        _Var24._M_p = local_128._M_dataplus._M_p;
        ppFVar22 = ppFVar22 + 1;
      } while (ppFVar22 != ppFVar13);
      if (local_128._M_dataplus._M_p != (pointer)local_128._M_string_length) {
        lVar33 = local_128._M_string_length - (long)local_128._M_dataplus._M_p;
        uVar15 = (lVar33 >> 3) * -0x3333333333333333;
        lVar26 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar26 == 0; lVar26 = lVar26 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                  (local_128._M_dataplus._M_p,local_128._M_string_length,
                   ((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar33 < 0x281) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                    (_Var24._M_p,sVar7);
        }
        else {
          puVar19 = (ushort *)(_Var24._M_p + 0x280);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                    (_Var24._M_p,puVar19);
          for (; puVar19 != (ushort *)sVar7; puVar19 = puVar19 + 0x14) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Val_comp_iter<flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>>
                      (puVar19);
          }
        }
      }
    }
    psVar31 = local_b0;
    sVar7 = local_128._M_string_length;
    local_100._0_8_ = &aStack_d0;
    local_100._8_8_ = 1;
    local_100._16_8_ = (byte *)0x0;
    local_100._24_8_ = 0;
    local_e0._M_max_load_factor = 1.0;
    local_e0._M_next_resize = 0;
    aStack_d0._M_allocated_capacity = 0;
    aStack_d0._M_local_buf[8] = '\0';
    if (local_128._M_dataplus._M_p != (pointer)local_128._M_string_length) {
      sVar25 = 0;
      _Var24._M_p = local_128._M_dataplus._M_p;
      do {
        sVar25 = sVar25 + (ushort)(*(int *)_Var24._M_p == -1);
        local_148._M_dataplus._M_p._0_2_ = sVar25;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,unsigned_short>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_100,(ushort *)((long)_Var24._M_p + 8),&local_148);
        sVar25 = sVar25 + 1;
        _Var24._M_p = _Var24._M_p + 0x28;
      } while (_Var24._M_p != (pointer)sVar7);
    }
    aStack_d0._M_local_buf[8] = 1;
LAB_002c9a5c:
    pPVar23 = local_c0;
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_128);
    if ((aStack_d0._M_local_buf[8] & 1U) != 0) {
LAB_002c8df1:
      pSVar20 = local_108;
      if (((pPVar23->opts).include_dependence_headers != true) ||
         ((local_108->super_Definition).generated == false)) {
        GenNameSpace((local_108->super_Definition).defined_namespace,(string *)local_68,&local_40);
        GenComment(&(pSVar20->super_Definition).doc_comment,(string *)local_68,(CommentConfig *)0x0,
                   "");
        std::operator+(&local_128,"table ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar20)
        ;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar19 = (ushort *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
          local_148.field_2._8_8_ = puVar8[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
          local_148._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_148._M_string_length = puVar8[1];
        *puVar8 = puVar19;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_68,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        ppFVar13 = (local_108->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar22 = (local_108->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppFVar22 != ppFVar13;
            ppFVar22 = ppFVar22 + 1) {
          pFVar5 = *ppFVar22;
          if ((pFVar5->value).type.base_type != BASE_TYPE_UTYPE) {
            GenComment(&(pFVar5->super_Definition).doc_comment,(string *)local_68,
                       (CommentConfig *)0x0,"  ");
            std::operator+(&local_a8,"  ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar5);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_128.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_128.field_2._8_8_ = puVar8[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_128._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_128._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            (anonymous_namespace)::GenType_abi_cxx11_
                      (&local_88,(_anonymous_namespace_ *)&pFVar5->value,(Type *)0x0,
                       SUB81(puVar19,0));
            uVar27 = (byte *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              uVar27 = local_128.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar27 < (byte *)(local_128._M_string_length + local_88._M_string_length)) {
              uVar27 = (byte *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                uVar27 = local_88.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar27 < (byte *)(local_128._M_string_length + local_88._M_string_length))
              goto LAB_002c8ffe;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_88,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
            }
            else {
LAB_002c8ffe:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_128,(ulong)local_88._M_dataplus._M_p);
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            puVar19 = (ushort *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148.field_2._8_8_ = puVar8[3];
            }
            else {
              local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
              local_148._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_148._M_string_length = puVar8[1];
            *puVar8 = puVar19;
            puVar8[1] = 0;
            *(byte *)puVar19 = 0;
            std::__cxx11::string::_M_append((char *)local_68,(ulong)local_148._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,
                              (ulong)(local_88.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              (ulong)(local_128.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,
                              (ulong)(local_a8.field_2._M_allocated_capacity + 1));
            }
            psVar31 = &(pFVar5->value).constant;
            iVar28 = std::__cxx11::string::compare((char *)psVar31);
            if (iVar28 != 0) {
              std::operator+(&local_148," = ",psVar31);
              std::__cxx11::string::_M_append((char *)local_68,(ulong)local_148._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                (ulong)(local_148.field_2._M_allocated_capacity + 1));
              }
            }
            local_a8._M_dataplus._M_p = (pointer)0x0;
            local_a8._M_string_length = 0;
            local_a8.field_2._M_allocated_capacity = 0;
            if (pFVar5->presence == kRequired) {
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"required","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_a8,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                (ulong)(local_148.field_2._M_allocated_capacity + 1));
              }
            }
            if (pFVar5->key == true) {
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"key","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_a8,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                (ulong)(local_148.field_2._M_allocated_capacity + 1));
              }
            }
            if (((local_c0->opts).keep_proto_id == true) &&
               (cVar12 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_100,(key_type *)pFVar5),
               cVar12.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
               ._M_cur != (__node_type *)0x0)) {
              NumToString<unsigned_short>
                        (&local_128,
                         *(unsigned_short *)
                          ((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
                                 ._M_cur + 0x28));
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x3583ce);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              puVar19 = (ushort *)(puVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                local_148.field_2._8_8_ = puVar8[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *(undefined8 *)puVar19;
                local_148._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_148._M_string_length = puVar8[1];
              *puVar8 = puVar19;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_a8,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                (ulong)(local_148.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                (ulong)(local_128.field_2._M_allocated_capacity + 1));
              }
            }
            if (local_a8._M_dataplus._M_p != (pointer)local_a8._M_string_length) {
              std::__cxx11::string::append((char *)local_68);
              sVar7 = local_a8._M_string_length;
              for (_Var24._M_p = local_a8._M_dataplus._M_p; _Var24._M_p != (pointer)sVar7;
                  _Var24._M_p = _Var24._M_p + 0x20) {
                local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_148,*(size_type *)_Var24._M_p,
                           *(long *)((long)_Var24._M_p + 8) + *(size_type *)_Var24._M_p);
                std::__cxx11::string::append((char *)&local_148);
                std::__cxx11::string::_M_append((char *)local_68,(ulong)local_148._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  (ulong)(local_148.field_2._M_allocated_capacity + 1));
                }
              }
              std::__cxx11::string::pop_back();
              std::__cxx11::string::append((char *)local_68);
            }
            std::__cxx11::string::append((char *)local_68);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a8);
            ppFVar13 = (local_108->fields).vec.
                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        std::__cxx11::string::append((char *)local_68);
        pPVar23 = local_c0;
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_100);
      local_38 = local_38 + 1;
      if (local_38 ==
          (pPVar23->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_002c9ac5;
      goto LAB_002c8d2a;
    }
  }
  else {
joined_r0x002c9bde:
    if ((char)local_b4 == '\0') {
      _GLOBAL__N_1::GenerateFBS();
    }
LAB_002c9b35:
    local_100._0_8_ = &aStack_d0;
    local_100._8_8_ = 1;
    local_100._16_8_ = (byte *)0x0;
    local_100._24_8_ = 0;
    local_e0._M_max_load_factor = 1.0;
    local_e0._4_4_ = 0;
    local_e0._M_next_resize = 0;
    aStack_d0._M_allocated_capacity = 0;
    aStack_d0._M_local_buf[8] = 0;
  }
  (psVar31->_M_dataplus)._M_p = (pointer)&psVar31->field_2;
  psVar31->_M_string_length = 0;
  (psVar31->field_2)._M_local_buf[0] = '\0';
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  if ((string *)local_68._0_8_ == (string *)(local_68 + 0x10)) {
    return (string *)(local_68 + 0x10);
  }
  operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
  return extraout_RAX;
}

Assistant:

static std::string GenerateFBS(const Parser &parser,
                               const std::string &file_name,
                               bool no_log = false) {
  // Proto namespaces may clash with table names, escape the ones that were
  // generated from a table:
  for (auto it = parser.namespaces_.begin(); it != parser.namespaces_.end();
       ++it) {
    auto &ns = **it;
    for (size_t i = 0; i < ns.from_table; i++) {
      ns.components[ns.components.size() - 1 - i] += "_";
    }

    if (parser.opts.proto_mode && !parser.opts.proto_namespace_suffix.empty()) {
      // Since we know that all these namespaces come from a .proto, and all are
      // being converted, we can simply apply this suffix to all of them.
      ns.components.insert(ns.components.end() - ns.from_table,
                           parser.opts.proto_namespace_suffix);
    }
  }

  std::string schema;
  schema += "// Generated from " + file_name + ".proto\n\n";
  if (parser.opts.include_dependence_headers) {
    // clang-format off
    int num_includes = 0;
    for (auto it = parser.included_files_.begin();
         it != parser.included_files_.end(); ++it) {
      if (it->second.empty()) {
        continue;
}
      std::string basename;
      if(parser.opts.keep_prefix) {
        basename = flatbuffers::StripExtension(it->second);
      } else {
        basename = flatbuffers::StripPath(
                flatbuffers::StripExtension(it->second));
      }
      schema += "include \"" + basename + ".fbs\";\n";
      num_includes++;
    }
    if (num_includes) schema += "\n";
    // clang-format on
  }

  // Generate code for all the enum declarations.
  const Namespace *last_namespace = nullptr;
  for (auto enum_def_it = parser.enums_.vec.begin();
       enum_def_it != parser.enums_.vec.end(); ++enum_def_it) {
    EnumDef &enum_def = **enum_def_it;
    if (parser.opts.include_dependence_headers && enum_def.generated) {
      continue;
    }
    GenNameSpace(*enum_def.defined_namespace, &schema, &last_namespace);
    GenComment(enum_def.doc_comment, &schema, nullptr);
    if (enum_def.is_union) {
      schema += "union " + enum_def.name;
    } else {
      schema += "enum " + enum_def.name + " : ";
    }

    schema += GenType(enum_def.underlying_type, true) + " {\n";

    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &schema, nullptr, "  ");
      if (enum_def.is_union) {
        schema += "  " + GenType(ev.union_type) + ",\n";
      } else {
        schema += "  " + ev.name + " = " + enum_def.ToString(ev) + ",\n";
      }
    }
    schema += "}\n\n";
  }
  // Generate code for all structs/tables.
  for (auto it = parser.structs_.vec.begin(); it != parser.structs_.vec.end();
       ++it) {
    StructDef &struct_def = **it;
    const auto proto_fbs_ids = MapProtoIdsToFieldsId(
        struct_def, parser.opts.proto_id_gap_action, no_log);
    if (!proto_fbs_ids.successful) { return {}; }

    if (parser.opts.include_dependence_headers && struct_def.generated) {
      continue;
    }

    GenNameSpace(*struct_def.defined_namespace, &schema, &last_namespace);
    GenComment(struct_def.doc_comment, &schema, nullptr);
    schema += "table " + struct_def.name + " {\n";
    for (auto field_it = struct_def.fields.vec.begin();
         field_it != struct_def.fields.vec.end(); ++field_it) {
      auto &field = **field_it;
      if (field.value.type.base_type != BASE_TYPE_UTYPE) {
        GenComment(field.doc_comment, &schema, nullptr, "  ");
        schema += "  " + field.name + ":" + GenType(field.value.type);
        if (field.value.constant != "0") schema += " = " + field.value.constant;
        std::vector<std::string> attributes;
        if (field.IsRequired()) attributes.push_back("required");
        if (field.key) attributes.push_back("key");

        if (parser.opts.keep_proto_id) {
          auto it = proto_fbs_ids.field_to_id.find(field.name);
          if (it != proto_fbs_ids.field_to_id.end()) {
            attributes.push_back("id: " + NumToString(it->second));
          }  // If not found it means we do not have any ids
        }

        if (!attributes.empty()) {
          schema += " (";
          for (const auto &attribute : attributes) {
            schema += attribute + ",";
          }
          schema.pop_back();
          schema += ")";
        }

        schema += ";\n";
      }
    }
    schema += "}\n\n";
  }
  return schema;
}